

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O3

void __thiscall ot::commissioner::DtlsSession::HandleEvent(DtlsSession *this,short aFlags)

{
  char cVar1;
  State SVar2;
  undefined4 uVar3;
  char *from;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  byte bVar5;
  _Alloc_hider _Var6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  bool bVar7;
  string_view fmt;
  format_args args;
  Error error;
  writer write;
  type local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  type local_170;
  undefined4 uStack_16c;
  char *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *pfStack_150;
  code *local_148;
  code *pcStack_140;
  code *local_138;
  string local_130;
  undefined1 local_110 [32];
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  char local_d8 [16];
  string local_c8;
  type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  type local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_1a0 = none_type;
  local_198 = local_188;
  local_190 = 0;
  local_188[0] = 0;
  if ((this->mIsServer == true) && (this->mIsClientIdSet == false)) {
    SetClientTransportId((Error *)local_178,this);
    uVar3 = local_178._0_4_;
    local_1a0 = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_16c,local_170) != &local_160) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_16c,local_170));
    }
    if (uVar3 != none_type) goto LAB_001e1468;
  }
  if (this->mState == kConnected) {
LAB_001e11f1:
    if ((local_1a0 == none_type & (byte)((ushort)aFlags >> 1) & 0x7f) == 1) {
      do {
        Read((Error *)local_178,this);
        uVar3 = local_178._0_4_;
        local_1a0 = local_178._0_4_;
        std::__cxx11::string::operator=((string *)&local_198,(string *)&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_16c,local_170) != &local_160) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_16c,local_170));
        }
      } while (uVar3 == none_type);
    }
    if ((aFlags & 4U) == 0) goto LAB_001e1468;
    local_a8 = local_1a0;
    paVar4 = &local_90;
    local_a0[0] = paVar4;
    std::__cxx11::string::_M_construct<char*>((string *)local_a0,local_198,local_198 + local_190);
    _Var6._M_p = (pointer)local_a0[0];
    if ((cstring_type < local_a8) || ((0x1201U >> (local_a8 & 0x1f) & 1) == 0)) goto LAB_001e154b;
    if (local_a0[0] != paVar4) {
      operator_delete(local_a0[0]);
    }
    TryWrite((Error *)local_178,this);
    local_1a0 = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_170);
    paVar4 = &local_160;
    _Var6._M_p = (pointer)CONCAT44(uStack_16c,local_170);
LAB_001e145e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p == paVar4) goto LAB_001e1468;
  }
  else {
    if (this->mState != kConnecting) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"dtls","");
      local_178 = (undefined1  [8])0x10000000e;
      local_170 = string_type;
      from = "session(={}) received event {:X} in state {}";
      local_168 = "session(={}) received event {:X} in state {}";
      local_160._M_allocated_capacity = 0x2c;
      local_160._8_8_ = 0x300000000;
      local_148 = ::fmt::v10::detail::
                  parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      pcStack_140 = ::fmt::v10::detail::
                    parse_format_specs<short,fmt::v10::detail::compile_parse_context<char>>;
      local_138 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pfStack_150 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                    local_178;
      local_110._0_8_ =
           (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)local_178;
      do {
        cVar1 = *from;
        to = from;
        while (cVar1 != '{') {
          to = to + 1;
          if (to == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_110,from,"");
            goto LAB_001e13c1;
          }
          cVar1 = *to;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_110,from,to);
        from = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,short,std::__cxx11::string>&>
                         (to,"",(format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>
                                 *)local_178);
      } while (from != "");
LAB_001e13c1:
      GetStateString_abi_cxx11_((string *)local_110,this);
      local_168 = (char *)(ulong)(uint)(int)aFlags;
      local_160._8_8_ = local_110._0_8_;
      pfStack_150 = (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
                    local_110._8_8_;
      fmt.size_ = 0xd1e;
      fmt.data_ = (char *)0x2c;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_178;
      local_178 = (undefined1  [8])this;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_c8,(v10 *)"session(={}) received event {:X} in state {}",fmt,args);
      Log(kDebug,&local_130,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
          local_110._0_8_ !=
          (format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long> *)
          (local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_);
      }
      paVar4 = &local_130.field_2;
      _Var6._M_p = local_130._M_dataplus._M_p;
      goto LAB_001e145e;
    }
    Handshake((Error *)local_178,this);
    uVar3 = local_178._0_4_;
    local_1a0 = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_16c,local_170) != &local_160) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_16c,local_170));
    }
    local_80 = uVar3;
    paVar4 = &local_68;
    local_78[0] = paVar4;
    std::__cxx11::string::_M_construct<char*>((string *)local_78,local_198,local_198 + local_190);
    _Var6._M_p = (pointer)local_78[0];
    if ((local_80 < string_type) && ((0x1201U >> (local_80 & 0x1f) & 1) != 0)) {
      SVar2 = this->mState;
      if (local_78[0] != paVar4) {
        operator_delete(local_78[0]);
      }
      if (SVar2 != kConnected) goto LAB_001e1468;
      goto LAB_001e11f1;
    }
LAB_001e154b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p == paVar4) goto LAB_001e1468;
  }
  operator_delete(_Var6._M_p);
LAB_001e1468:
  local_58 = local_1a0;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_198,local_198 + local_190);
  bVar7 = cstring_type < local_58;
  bVar5 = (byte)local_58;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((0xdfeU >> (bVar5 & 0x1f) & 1) != 0 || bVar7) {
    local_f0._0_4_ = local_1a0;
    local_e8._M_p = local_d8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_198,local_198 + local_190);
    Disconnect(this,(Error *)local_f0);
    if (local_e8._M_p != local_d8) {
      operator_delete(local_e8._M_p);
    }
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  return;
}

Assistant:

void DtlsSession::HandleEvent(short aFlags)
{
    Error error;

    if (mIsServer && !mIsClientIdSet)
    {
        SuccessOrExit(error = SetClientTransportId());
    }

    switch (mState)
    {
    case State::kConnecting:
        error = Handshake();
        if (ShouldStop(error) || mState != State::kConnected)
        {
            break;
        }

        // Fall through

    case State::kConnected:
        if (aFlags & EV_READ)
        {
            while (error == ErrorCode::kNone)
            {
                error = Read();
            }
        }
        if ((aFlags & EV_WRITE) && !ShouldStop(error))
        {
            error = TryWrite();
        }
        break;

    default:
        // Ignore incoming data when the DTLS session is disconnected.

        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) received event {:X} in state {}", static_cast<void *>(this), aFlags,
                  GetStateString());
        break;
    }

exit:
    if (ShouldStop(error))
    {
        Disconnect(error);
    }
}